

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFightingFactored.cpp
# Opt level: O2

void __thiscall
ProblemFireFightingFactored::ProblemFireFightingFactored
          (ProblemFireFightingFactored *this,size_t nrAgents,size_t nrHouses,size_t nrFLs,
          double costOfMove,bool forcePositionRepres,double multipleAgentExtinguishProb,
          bool initialize)

{
  undefined1 *this_00;
  E *this_01;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  allocator<char> local_b3;
  allocator<char> local_b2;
  allocator<char> local_b1;
  undefined4 local_b0;
  undefined4 local_ac;
  size_t local_a8;
  double local_a0;
  double local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_b0 = CONCAT31(in_register_00000089,initialize);
  this_00 = &this->field_0x780;
  local_ac = (undefined4)CONCAT71(in_register_00000081,forcePositionRepres);
  *(undefined ***)&this->field_0x780 = &PTR__POSGInterface_005efde8;
  local_a8 = nrFLs;
  local_a0 = costOfMove;
  local_98 = multipleAgentExtinguishProb;
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)this_00,&PTR_PTR_005ed9e0);
  *(undefined8 *)&this->field_0x788 = 0x5effd0;
  *(undefined8 *)&this->field_0x780 = 0x5f0180;
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)this_00,&PTR_construction_vtable_232__005ed9b8);
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface::
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface
            ((MultiAgentDecisionProcessDiscreteFactoredStatesInterface *)&this->field_0x788,
             &PTR_construction_vtable_544__005eda18);
  FactoredDecPOMDPDiscreteInterface::FactoredDecPOMDPDiscreteInterface
            ((FactoredDecPOMDPDiscreteInterface *)this_00,&PTR_construction_vtable_352__005ed980);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"temp-name",&local_b1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"temp-description",&local_b2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"none",&local_b3);
  FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete
            (&this->super_FactoredDecPOMDPDiscrete,&PTR_construction_vtable_112__005ed8a8,&local_50,
             &local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined8 *)
   &(this->super_FactoredDecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscreteFactoredStates.
    super_MultiAgentDecisionProcess = 0x5ecd20;
  *(undefined8 *)&this->field_0x780 = 0x5ed320;
  *(undefined8 *)&this->field_0x788 = 0x5ed688;
  *(undefined8 *)
   &(this->super_FactoredDecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscreteFactoredStates.
    field_0x600 = 0x5ed120;
  *(size_t *)&(this->super_FactoredDecPOMDPDiscrete).field_0x708 = nrAgents;
  *(size_t *)&(this->super_FactoredDecPOMDPDiscrete).field_0x710 = nrHouses;
  this->_m_nrFireLevels = local_a8;
  this->_m_costOfMove = local_a0;
  this->_m_forcePositionRepres = SUB41(local_ac,0);
  this->_m_multipleAgentExtinguishProb = local_98;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((0.0 <= local_98) && (local_98 <= 1.0)) {
    if ((char)local_b0 != '\0') {
      InitializePFFF(this);
    }
    return;
  }
  this_01 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_01,"ProblemFireFightingFactored::ctor multipleAgentExtinguishProb should be >=0 and <=1"
      );
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

ProblemFireFightingFactored::ProblemFireFightingFactored(
        size_t nrAgents, size_t nrHouses, size_t nrFLs,
        double costOfMove, bool forcePositionRepres,
        double multipleAgentExtinguishProb, bool initialize)
    :
        FactoredDecPOMDPDiscrete(
                "temp-name",
                "temp-description",
                "none"),
        _m_nrAgents(nrAgents),
        _m_nrHouses(nrHouses),
        _m_nrFireLevels(nrFLs),
        _m_costOfMove(costOfMove),
        _m_forcePositionRepres(forcePositionRepres),
        _m_multipleAgentExtinguishProb(multipleAgentExtinguishProb)
{
    if(_m_multipleAgentExtinguishProb<0 ||
       _m_multipleAgentExtinguishProb>1)
           throw(E("ProblemFireFightingFactored::ctor multipleAgentExtinguishProb should be >=0 and <=1"));

    if(initialize)
        InitializePFFF();
}